

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz_encoder.c
# Opt level: O0

lzma_ret lzma_lz_encoder_init
                   (lzma_next_coder *next,lzma_allocator *allocator,lzma_filter_info *filters,
                   _func_lzma_ret_lzma_lz_encoder_ptr_lzma_allocator_ptr_void_ptr_lzma_lz_options_ptr
                   *lz_init)

{
  _Bool _Var1;
  undefined1 local_c0 [4];
  lzma_ret ret_;
  lzma_lz_options_conflict lz_options;
  lzma_lz_encoder *local_38;
  lzma_coder_conflict *coder;
  _func_lzma_ret_lzma_lz_encoder_ptr_lzma_allocator_ptr_void_ptr_lzma_lz_options_ptr *lz_init_local;
  lzma_filter_info *filters_local;
  lzma_allocator *allocator_local;
  lzma_next_coder *next_local;
  
  local_38 = (lzma_lz_encoder *)next->coder;
  if (local_38 == (lzma_lz_encoder *)0x0) {
    local_38 = (lzma_lz_encoder *)lzma_alloc(0xe0,allocator);
    if (local_38 == (lzma_lz_encoder *)0x0) {
      return LZMA_MEM_ERROR;
    }
    next->coder = local_38;
    next->code = lz_encode;
    next->end = lz_encoder_end;
    next->update = lz_encoder_update;
    local_38->coder = (void *)0x0;
    local_38->code = (_func_lzma_ret_void_ptr_lzma_mf_ptr_uint8_t_ptr_size_t_ptr_size_t *)0x0;
    local_38->end = (_func_void_void_ptr_lzma_allocator_ptr *)0x0;
    local_38[1].coder = (void *)0x0;
    *(undefined4 *)&local_38[1].code = 0;
    local_38[3].coder = (void *)0x0;
    local_38[3].code = (_func_lzma_ret_void_ptr_lzma_mf_ptr_uint8_t_ptr_size_t_ptr_size_t *)0x0;
    *(undefined4 *)((long)&local_38[4].code + 4) = 0;
    *(undefined4 *)&local_38[4].end = 0;
    memset(&lz_options.preset_dict_size,0,0x48);
    memcpy(&local_38[4].options_update,&lz_options.preset_dict_size,0x48);
  }
  next_local._4_4_ =
       (*lz_init)(local_38,allocator,filters->options,(lzma_lz_options_conflict *)local_c0);
  if (next_local._4_4_ == LZMA_OK) {
    _Var1 = lz_encoder_prepare((lzma_mf *)(local_38 + 1),allocator,
                               (lzma_lz_options_conflict *)local_c0);
    if (_Var1) {
      next_local._4_4_ = LZMA_OPTIONS_ERROR;
    }
    else {
      _Var1 = lz_encoder_init((lzma_mf *)(local_38 + 1),allocator,
                              (lzma_lz_options_conflict *)local_c0);
      if (_Var1) {
        next_local._4_4_ = LZMA_MEM_ERROR;
      }
      else {
        next_local._4_4_ =
             lzma_next_filter_init
                       ((lzma_next_coder *)&local_38[4].options_update,allocator,filters + 1);
      }
    }
  }
  return next_local._4_4_;
}

Assistant:

extern lzma_ret
lzma_lz_encoder_init(lzma_next_coder *next, const lzma_allocator *allocator,
		const lzma_filter_info *filters,
		lzma_ret (*lz_init)(lzma_lz_encoder *lz,
			const lzma_allocator *allocator, const void *options,
			lzma_lz_options *lz_options))
{
#ifdef HAVE_SMALL
	// We need that the CRC32 table has been initialized.
	lzma_crc32_init();
#endif

	// Allocate and initialize the base data structure.
	lzma_coder *coder = next->coder;
	if (coder == NULL) {
		coder = lzma_alloc(sizeof(lzma_coder), allocator);
		if (coder == NULL)
			return LZMA_MEM_ERROR;

		next->coder = coder;
		next->code = &lz_encode;
		next->end = &lz_encoder_end;
		next->update = &lz_encoder_update;

		coder->lz.coder = NULL;
		coder->lz.code = NULL;
		coder->lz.end = NULL;

		// mf.size is initialized to silence Valgrind
		// when used on optimized binaries (GCC may reorder
		// code in a way that Valgrind gets unhappy).
		coder->mf.buffer = NULL;
		coder->mf.size = 0;
		coder->mf.hash = NULL;
		coder->mf.son = NULL;
		coder->mf.hash_count = 0;
		coder->mf.sons_count = 0;

		coder->next = LZMA_NEXT_CODER_INIT;
	}

	// Initialize the LZ-based encoder.
	lzma_lz_options lz_options;
	return_if_error(lz_init(&coder->lz, allocator,
			filters[0].options, &lz_options));

	// Setup the size information into coder->mf and deallocate
	// old buffers if they have wrong size.
	if (lz_encoder_prepare(&coder->mf, allocator, &lz_options))
		return LZMA_OPTIONS_ERROR;

	// Allocate new buffers if needed, and do the rest of
	// the initialization.
	if (lz_encoder_init(&coder->mf, allocator, &lz_options))
		return LZMA_MEM_ERROR;

	// Initialize the next filter in the chain, if any.
	return lzma_next_filter_init(&coder->next, allocator, filters + 1);
}